

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O0

kbool_t KRuntime_tryCallMethod(KonohaContext *kctx,KonohaStack *sfp)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  undefined8 uVar4;
  long in_RSI;
  long in_RDI;
  size_t _gcstackpos;
  kArray *_GcStack;
  int jumpResult;
  kbool_t result;
  KTraceInfo *trace;
  KTraceInfo traceREF_;
  jmp_buf lbuf;
  KonohaStack *bottomStack;
  KRuntimeContextVar *runtime;
  bool local_109;
  long local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined1 local_e8 [200];
  undefined8 local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_18 = *(long *)(in_RDI + 0x28);
  local_20 = *(undefined8 *)(local_18 + 0x70);
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_e8,0,200);
  if (*(long *)(local_18 + 0x68) == 0) {
    local_100 = local_10;
    local_f8 = *(undefined8 *)(local_10 + -0x38);
    local_f0 = 0;
    local_ec = 0;
    uVar4 = (**(code **)(*(long *)(local_8 + 0x10) + 0x1f8))(local_8,200,&local_100);
    *(undefined8 *)(local_18 + 0x68) = uVar4;
  }
  memcpy(local_e8,*(void **)(local_18 + 0x68),200);
  *(long *)(local_18 + 0x70) = local_10;
  *(undefined8 *)(local_18 + 0x60) = *(undefined8 *)(*(long *)(local_8 + 0x20) + 0x30);
  lVar1 = *(long *)(*(long *)(local_8 + 0x28) + 0x20);
  uVar2 = *(ulong *)(lVar1 + 0x18);
  iVar3 = (**(code **)(*(long *)(local_8 + 0x10) + 0x38))(*(undefined8 *)(local_18 + 0x68));
  if (iVar3 != 0) {
    (**(code **)(*(long *)(local_8 + 0x10) + 0x1c0))
              (local_8,*(undefined8 *)(local_18 + 0x60),*(undefined8 *)(local_18 + 0x70),
               *(undefined8 *)(local_18 + 0x78));
  }
  else {
    *(undefined8 *)(local_10 + -0x28) = *(undefined8 *)(*(long *)(local_8 + 0x28) + 0x78);
    *(long *)(*(long *)(local_8 + 0x28) + 0x78) = local_10;
    (**(code **)(*(long *)(local_10 + -8) + 0x18))(local_8,local_10);
    *(undefined8 *)(*(long *)(local_8 + 0x28) + 0x78) = *(undefined8 *)(local_10 + -0x28);
  }
  local_109 = iVar3 == 0;
  (**(code **)(*(long *)(local_8 + 0x18) + 0x1e8))(local_8,lVar1,uVar2 >> 3);
  *(undefined8 *)(local_18 + 0x70) = local_20;
  memcpy(*(void **)(local_18 + 0x68),local_e8,200);
  return local_109;
}

Assistant:

static kbool_t KRuntime_tryCallMethod(KonohaContext *kctx, KonohaStack *sfp)
{
	KRuntimeContextVar *runtime = kctx->stack;
	KonohaStack *bottomStack = runtime->bottomStack;
	jmpbuf_i lbuf = {};
	if(runtime->evaljmpbuf == NULL) {
		KMakeTrace(trace, sfp);
		runtime->evaljmpbuf = (jmpbuf_i *)KCalloc(sizeof(jmpbuf_i), 1, trace);
	}
	memcpy(&lbuf, runtime->evaljmpbuf, sizeof(jmpbuf_i));
	runtime->bottomStack = sfp;
	KUnsafeFieldSet(runtime->ThrownException, (kException *)K_NULL);
	kbool_t result = true;
	int jumpResult;
	INIT_GCSTACK();
	if((jumpResult = PLATAPI setjmp_i(*runtime->evaljmpbuf)) == 0) {
		KStackCall(sfp);
	}
	else {
		PLATAPI ConsoleModule.ReportCaughtException(kctx, runtime->ThrownException, runtime->bottomStack, runtime->topStack);
		result = false;
	}
	RESET_GCSTACK();
	runtime->bottomStack = bottomStack;
	memcpy(runtime->evaljmpbuf, &lbuf, sizeof(jmpbuf_i));
	return result;
}